

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

bool __thiscall QPDF::isLinearized(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pMVar5;
  element_type *peVar6;
  qpdf_offset_t qVar7;
  char *str;
  longlong lVar8;
  undefined4 extraout_var;
  double __x;
  bool local_29a;
  qpdf_offset_t Li;
  string local_270 [32];
  undefined1 local_250 [8];
  QPDFObjectHandle L;
  allocator<char> local_231;
  string local_230 [32];
  undefined1 local_210 [8];
  QPDFObjectHandle linkey;
  undefined1 local_1f8 [8];
  QPDFObjectHandle candidate;
  allocator<char> local_1d1;
  string local_1d0;
  byte local_1a9;
  Token local_1a8;
  byte local_139;
  Token local_138;
  undefined1 local_d0 [8];
  Token t1;
  int local_54;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  unsigned_long local_40;
  size_t pos;
  string buffer;
  QPDF *this_local;
  
  buffer.field_2._8_8_ = this;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar5->file);
  InputSource::read_abi_cxx11_((InputSource *)&pos,(int)peVar6,(void *)0x400,0);
  local_40 = 0;
  do {
    local_50 = sv("0123456789",10);
    local_40 = std::__cxx11::string::
               find_first_of<std::basic_string_view<char,std::char_traits<char>>>
                         ((string *)&pos,&local_50,local_40);
    if (local_40 == 0xffffffffffffffff) {
      this_local._7_1_ = 0;
      break;
    }
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    qVar7 = toO<unsigned_long>(&local_40);
    (*peVar6->_vptr_InputSource[5])(peVar6,qVar7,0);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar5->file);
    readToken((Token *)local_d0,this,peVar6,0x14);
    local_139 = 0;
    local_1a9 = 0;
    bVar3 = false;
    bVar2 = false;
    bVar1 = QPDFTokenizer::Token::isInteger((Token *)local_d0);
    local_29a = false;
    if (bVar1) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar5->file);
      readToken(&local_138,this,peVar6,6);
      local_139 = 1;
      bVar1 = QPDFTokenizer::Token::isInteger(&local_138);
      local_29a = false;
      if (bVar1) {
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pMVar5->file);
        readToken(&local_1a8,this,peVar6,4);
        local_1a9 = 1;
        std::allocator<char>::allocator();
        bVar3 = true;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"obj",&local_1d1);
        bVar2 = true;
        local_29a = QPDFTokenizer::Token::isWord(&local_1a8,&local_1d0);
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    if (bVar3) {
      std::allocator<char>::~allocator(&local_1d1);
    }
    if ((local_1a9 & 1) != 0) {
      QPDFTokenizer::Token::~Token(&local_1a8);
    }
    if ((local_139 & 1) != 0) {
      QPDFTokenizer::Token::~Token(&local_138);
    }
    if (((local_29a ^ 0xffU) & 1) == 0) {
      QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)local_d0);
      str = (char *)std::__cxx11::string::data();
      linkey.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QUtil::string_to_ll(str);
      iVar4 = toI<long_long>((longlong *)
                             &linkey.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
      getObject((QPDF *)local_1f8,(int)this,iVar4);
      bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1f8);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_230,"/Linearized",&local_231);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_210,(string *)local_1f8);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_231);
        bVar3 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_210);
        bVar2 = false;
        if (bVar3) {
          __x = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_210);
          L.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)floor(__x);
          iVar4 = toI<double>((double *)
                              &L.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          bVar2 = iVar4 == 1;
        }
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_270,"/L",(allocator<char> *)((long)&Li + 7));
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_250,(string *)local_1f8);
          std::__cxx11::string::~string(local_270);
          std::allocator<char>::~allocator((allocator<char> *)((long)&Li + 7));
          bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_250);
          if (bVar2) {
            lVar8 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_250);
            pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&pMVar5->file);
            (*peVar6->_vptr_InputSource[5])(peVar6,0,2);
            pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                               (&this->m);
            peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&pMVar5->file);
            iVar4 = (*peVar6->_vptr_InputSource[4])();
            if (lVar8 == CONCAT44(extraout_var,iVar4)) {
              pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::
                       operator->(&this->m);
              (pMVar5->linp).file_size = lVar8;
              pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::
                       operator->(&this->m);
              QPDFObjectHandle::operator=(&pMVar5->lindict,(QPDFObjectHandle *)local_1f8);
              this_local._7_1_ = 1;
            }
            else {
              QTC::TC("qpdf","QPDF /L mismatch",0);
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_250);
        }
        else {
          this_local._7_1_ = 0;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_210);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_54 = 1;
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f8);
    }
    else {
      join_0x00000010_0x00000000_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
            )sv("0123456789",10);
      local_40 = std::__cxx11::string::
                 find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                           ((string *)&pos,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            &candidate.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            local_40);
      if (local_40 == 0xffffffffffffffff) {
        this_local._7_1_ = 0;
        local_54 = 1;
      }
      else {
        local_54 = 2;
      }
    }
    QPDFTokenizer::Token::~Token((Token *)local_d0);
  } while (local_54 == 2);
  std::__cxx11::string::~string((string *)&pos);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDF::isLinearized()
{
    // If the first object in the file is a dictionary with a suitable /Linearized key and has an /L
    // key that accurately indicates the file size, initialize m->lindict and return true.

    // A linearized PDF spec's first object will be contained within the first 1024 bytes of the
    // file and will be a dictionary with a valid /Linearized key.  This routine looks for that and
    // does no additional validation.

    // The PDF spec says the linearization dictionary must be completely contained within the first
    // 1024 bytes of the file. Add a byte for a null terminator.
    auto buffer = m->file->read(1024, 0);
    size_t pos = 0;
    while (true) {
        // Find a digit or end of buffer
        pos = buffer.find_first_of("0123456789"sv, pos);
        if (pos == std::string::npos) {
            return false;
        }
        // Seek to the digit. Then skip over digits for a potential
        // next iteration.
        m->file->seek(toO(pos), SEEK_SET);

        auto t1 = readToken(*m->file, 20);
        if (!(t1.isInteger() && readToken(*m->file, 6).isInteger() &&
              readToken(*m->file, 4).isWord("obj"))) {
            pos = buffer.find_first_not_of("0123456789"sv, pos);
            if (pos == std::string::npos) {
                return false;
            }
            continue;
        }

        auto candidate = getObject(toI(QUtil::string_to_ll(t1.getValue().data())), 0);
        if (!candidate.isDictionary()) {
            return false;
        }

        auto linkey = candidate.getKey("/Linearized");
        if (!(linkey.isNumber() && toI(floor(linkey.getNumericValue())) == 1)) {
            return false;
        }

        auto L = candidate.getKey("/L");
        if (!L.isInteger()) {
            return false;
        }
        qpdf_offset_t Li = L.getIntValue();
        m->file->seek(0, SEEK_END);
        if (Li != m->file->tell()) {
            QTC::TC("qpdf", "QPDF /L mismatch");
            return false;
        }
        m->linp.file_size = Li;
        m->lindict = candidate;
        return true;
    }
}